

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

void __thiscall
GlobOpt::TypeSpecializeFloatDst
          (GlobOpt *this,Instr *instr,Value *valToTransfer,Value *src1Value,Value *src2Value,
          Value **pDstVal)

{
  Opnd *this_00;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  RegOpnd *dst;
  Value *pVVar4;
  
  this_00 = instr->m_dst;
  if (this_00 == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x299c,"(dst)","dst");
    if (!bVar2) goto LAB_0042f2d7;
    *puVar3 = 0;
  }
  bVar2 = IR::Opnd::IsRegOpnd(this_00);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x299e,"(dst->IsRegOpnd())","What else?");
    if (!bVar2) {
LAB_0042f2d7:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  dst = IR::Opnd::AsRegOpnd(this_00);
  ToFloat64Dst(this,instr,dst,this->currentBlock);
  if (valToTransfer != (Value *)0x0) {
    pVVar4 = ValueNumberTransferDst(this,instr,valToTransfer);
    *pDstVal = pVVar4;
    GlobOptBlockData::InsertNewValue(&this->currentBlock->globOptData,pVVar4,this_00);
    return;
  }
  pVVar4 = CreateDstUntransferredValue(this,(ValueType)0x108,instr,src1Value,src2Value);
  *pDstVal = pVVar4;
  return;
}

Assistant:

void
GlobOpt::TypeSpecializeFloatDst(IR::Instr *instr, Value *valToTransfer, Value *const src1Value, Value *const src2Value, Value **pDstVal)
{
    IR::Opnd* dst = instr->GetDst();
    Assert(dst);

    AssertMsg(dst->IsRegOpnd(), "What else?");
    this->ToFloat64Dst(instr, dst->AsRegOpnd(), this->currentBlock);

    if(valToTransfer)
    {
        *pDstVal = this->ValueNumberTransferDst(instr, valToTransfer);
        CurrentBlockData()->InsertNewValue(*pDstVal, dst);
    }
    else
    {
        *pDstVal = CreateDstUntransferredValue(ValueType::Float, instr, src1Value, src2Value);
    }
}